

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_type_info.cpp
# Opt level: O1

void __thiscall duckdb::CreateTypeInfo::CreateTypeInfo(CreateTypeInfo *this)

{
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"main","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,anon_var_dwarf_63b5960 + 9);
  CreateInfo::CreateInfo(&this->super_CreateInfo,TYPE_ENTRY,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTypeInfo_02492550;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&this->type);
  (this->query).super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
  _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  this->bind_function = (bind_logical_type_function_t)0x0;
  return;
}

Assistant:

CreateTypeInfo::CreateTypeInfo() : CreateInfo(CatalogType::TYPE_ENTRY), bind_function(nullptr) {
}